

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O1

int __thiscall ncnn::GridSample::load_param(GridSample *this,ParamDict *pd)

{
  int iVar1;
  char *__format;
  
  iVar1 = ParamDict::get(pd,0,1);
  this->sample_type = iVar1;
  iVar1 = ParamDict::get(pd,1,1);
  this->padding_mode = iVar1;
  iVar1 = ParamDict::get(pd,2,0);
  this->align_corner = iVar1;
  iVar1 = ParamDict::get(pd,3,0);
  this->permute_fusion = iVar1;
  if (this->sample_type - 4U < 0xfffffffd) {
    __format = "unsupported sample type %d";
  }
  else {
    if (0xfffffffc < this->padding_mode - 4U) {
      return 0;
    }
    __format = "unsupported padding mode %d";
  }
  fprintf(_stderr,__format);
  fputc(10,_stderr);
  return -1;
}

Assistant:

int GridSample::load_param(const ParamDict& pd)
{
    sample_type = pd.get(0, 1);
    padding_mode = pd.get(1, 1);
    align_corner = pd.get(2, 0);
    permute_fusion = pd.get(3, 0);

    if (sample_type < 1 || sample_type > 3)
    {
        NCNN_LOGE("unsupported sample type %d", sample_type);
        return -1;
    }

    if (padding_mode < 1 || padding_mode > 3)
    {
        NCNN_LOGE("unsupported padding mode %d", padding_mode);
        return -1;
    }

    return 0;
}